

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O3

void __thiscall docopt::Command::~Command(Command *this)

{
  Kind KVar1;
  pointer pbVar2;
  pointer pcVar3;
  
  (this->super_Argument).super_LeafPattern.super_Pattern._vptr_Pattern =
       (_func_int **)&PTR_flat_001992f8;
  KVar1 = (this->super_Argument).super_LeafPattern.fValue.kind;
  if (KVar1 == StringList) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&(this->super_Argument).super_LeafPattern.fValue.variant.strList);
  }
  else if ((KVar1 == String) &&
          (pbVar2 = (this->super_Argument).super_LeafPattern.fValue.variant.strList.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          pbVar2 != (pointer)((long)&(this->super_Argument).super_LeafPattern.fValue.variant + 0x10)
          )) {
    operator_delete(pbVar2);
  }
  pcVar3 = (this->super_Argument).super_LeafPattern.fName._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->super_Argument).super_LeafPattern.fName.field_2) {
    operator_delete(pcVar3);
  }
  operator_delete(this);
  return;
}

Assistant:

Command(std::string name, value v = value{false})
		: Argument(std::move(name), std::move(v))
		{}